

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborstreamreader.cpp
# Opt level: O0

void __thiscall QCborStreamReaderPrivate::~QCborStreamReaderPrivate(QCborStreamReaderPrivate *this)

{
  QStack<CborValue>::~QStack((QStack<CborValue> *)0x8dc550);
  QByteArray::~QByteArray((QByteArray *)0x8dc55e);
  return;
}

Assistant:

~QCborStreamReaderPrivate()
    {
    }